

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_CreateSignalIn(Cba_Ntk_t *p,Prs_Ntk_t *pNtk,int Sig)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  
  if (Sig < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x13d,"int Abc_Lit2Var2(int)");
  }
  if (Sig == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)Sig >> 2;
    switch(Sig & 3) {
    case 0:
      pcVar2 = Abc_NamStr(pNtk->pStrs,uVar3);
      iVar1 = Cba_NtkNewStrId(p,pcVar2);
      iVar1 = Prs_CreateVerilogFindFon(p,iVar1);
      return iVar1;
    case 1:
      if ((int)uVar3 < (pNtk->vSlices).nSize) {
        pcVar2 = Abc_NamStr(pNtk->pStrs,(pNtk->vSlices).pArray[uVar3]);
        iVar1 = Cba_NtkNewStrId(p,pcVar2);
        iVar1 = Prs_CreateVerilogFindFon(p,iVar1);
        if (iVar1 == 0) {
          return 0;
        }
        uVar3 = uVar3 + 1;
        if ((int)uVar3 < (pNtk->vSlices).nSize) {
          iVar1 = Prs_CreateSlice(p,iVar1,(Prs_Ntk_t *)(ulong)uVar3,
                                  (pNtk->vSlices).pArray[(long)(ulong)uVar3]);
          return iVar1;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    case 2:
      uVar3 = ~uVar3;
      break;
    case 3:
      iVar1 = Prs_CreateCatIn(p,pNtk,uVar3);
      return iVar1;
    }
  }
  return uVar3;
}

Assistant:

int Prs_CreateSignalIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Sig )
{
    int iFon, Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( !Sig ) return 0;
    if ( Type == CBA_PRS_NAME )
        return Prs_CreateVerilogFindFon( p, Cba_NtkNewStrId(p, Prs_NtkStr(pNtk, Value)) );
    if ( Type == CBA_PRS_CONST )
        return Cba_FonFromConst( Value );
    if ( Type == CBA_PRS_SLICE )
    {
        iFon =  Prs_CreateVerilogFindFon( p, Cba_NtkNewStrId(p, Prs_NtkStr(pNtk, Prs_SliceName(pNtk, Value))) );
        if ( !iFon )
            return 0;
        return Prs_CreateSlice( p, iFon, pNtk, Prs_SliceRange(pNtk, Value) );
    }
    assert( Type == CBA_PRS_CONCAT );
    return Prs_CreateCatIn( p, pNtk, Value );
}